

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O1

void __thiscall
asio::detail::
reactive_socket_send_op<asio::detail::prepared_buffers<asio::const_buffer,_64UL>,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>_>
::reactive_socket_send_op
          (reactive_socket_send_op<asio::detail::prepared_buffers<asio::const_buffer,_64UL>,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>_>
           *this,socket_type socket,state_type state,
          prepared_buffers<asio::const_buffer,_64UL> *buffers,message_flags flags,
          write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
          *handler)

{
  implementation_type psVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  error_category *peVar5;
  
  (this->
  super_reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>).
  super_reactor_op.super_operation.next_ = (scheduler_operation *)0x0;
  (this->
  super_reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>).
  super_reactor_op.super_operation.func_ = do_complete;
  (this->
  super_reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>).
  super_reactor_op.super_operation.task_result_ = 0;
  (this->
  super_reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>).
  super_reactor_op.ec_._M_value = 0;
  peVar5 = (error_category *)std::_V2::system_category();
  (this->
  super_reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>).
  super_reactor_op.ec_._M_cat = peVar5;
  (this->
  super_reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>).
  super_reactor_op.bytes_transferred_ = 0;
  (this->
  super_reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>).
  super_reactor_op.perform_func_ =
       reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>::
       do_perform;
  (this->
  super_reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>).
  socket_ = socket;
  (this->
  super_reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>).
  state_ = state;
  memcpy(&(this->
          super_reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
          ).buffers_,buffers,0x108);
  (this->
  super_reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>).
  flags_ = flags;
  (this->handler_).stream_ = handler->stream_;
  std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::vector
            (&(this->handler_).buffers_.buffers_,&(handler->buffers_).buffers_);
  sVar2 = (handler->buffers_).total_consumed_;
  sVar3 = (handler->buffers_).next_elem_;
  sVar4 = (handler->buffers_).next_elem_offset_;
  (this->handler_).buffers_.total_size_ = (handler->buffers_).total_size_;
  (this->handler_).buffers_.total_consumed_ = sVar2;
  (this->handler_).buffers_.next_elem_ = sVar3;
  (this->handler_).buffers_.next_elem_offset_ = sVar4;
  (this->handler_).start_ = handler->start_;
  psVar1 = (handler->handler_).dispatcher_.impl_;
  (this->handler_).handler_.dispatcher_.service_ = (handler->handler_).dispatcher_.service_;
  (this->handler_).handler_.dispatcher_.impl_ = psVar1;
  std::
  _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>
  ::_Bind(&(this->handler_).handler_.handler_,&(handler->handler_).handler_);
  return;
}

Assistant:

reactive_socket_send_op(socket_type socket,
      socket_ops::state_type state, const ConstBufferSequence& buffers,
      socket_base::message_flags flags, Handler& handler)
    : reactive_socket_send_op_base<ConstBufferSequence>(socket,
        state, buffers, flags, &reactive_socket_send_op::do_complete),
      handler_(ASIO_MOVE_CAST(Handler)(handler))
  {
    handler_work<Handler>::start(handler_);
  }